

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O1

int sha512_done(sha512_state *md,uchar *out)

{
  ulong uVar1;
  int iVar2;
  undefined8 in_RAX;
  ulong uVar3;
  
  iVar2 = (int)CONCAT71((int7)((ulong)in_RAX >> 8),md == (sha512_state *)0x0);
  if (out != (uchar *)0x0 && md != (sha512_state *)0x0) {
    uVar3 = md->curlen;
    if (uVar3 < 0x80) {
      md->length = md->length + uVar3 * 8;
      md->curlen = uVar3 + 1;
      md->buf[uVar3] = 0x80;
      if (0x70 < md->curlen) {
        uVar3 = md->curlen;
        if (md->curlen < 0x80) {
          do {
            uVar1 = uVar3 + 1;
            md->curlen = uVar1;
            md->buf[uVar3] = '\0';
            uVar3 = uVar1;
          } while (uVar1 != 0x80);
        }
        s_sha512_compress(md,md->buf);
        md->curlen = 0;
      }
      uVar3 = md->curlen;
      if (md->curlen < 0x78) {
        do {
          uVar1 = uVar3 + 1;
          md->curlen = uVar1;
          md->buf[uVar3] = '\0';
          uVar3 = uVar1;
        } while (uVar1 != 0x78);
      }
      uVar3 = md->length;
      *(ulong *)(md->buf + 0x78) =
           uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
           (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
           (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
      s_sha512_compress(md,md->buf);
      uVar3 = 0;
      do {
        out[uVar3 * 8] = *(uchar *)((long)md->state + uVar3 * 8 + 7);
        out[uVar3 * 8 + 1] = *(uchar *)((long)md->state + uVar3 * 8 + 6);
        out[uVar3 * 8 + 2] = *(uchar *)((long)md->state + uVar3 * 8 + 5);
        out[uVar3 * 8 + 3] = *(uchar *)((long)md->state + uVar3 * 8 + 4);
        out[uVar3 * 8 + 4] = *(uchar *)((long)md->state + uVar3 * 8 + 3);
        out[uVar3 * 8 + 5] = *(uchar *)((long)md->state + uVar3 * 8 + 2);
        out[uVar3 * 8 + 6] = *(uchar *)((long)md->state + uVar3 * 8 + 1);
        out[uVar3 * 8 + 7] = (uchar)md->state[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar3 != 8);
    }
    iVar2 = (int)uVar3;
  }
  return iVar2;
}

Assistant:

static int sha512_done(struct sha512_state * md, unsigned char *out)
{
    int i;

    if (md == NULL) return -1;
    if (out == NULL) return -1;

    if (md->curlen >= sizeof(md->buf)) {
       return -1;
    }

    /* increase the length of the message */
    md->length += md->curlen * CONST64(8);

    /* append the '1' bit */
    md->buf[md->curlen++] = (unsigned char)0x80;

    /* if the length is currently above 112 bytes we append zeros
     * then compress.  Then we can fall back to padding zeros and length
     * encoding like normal.
     */
    if (md->curlen > 112) {
        while (md->curlen < 128) {
            md->buf[md->curlen++] = (unsigned char)0;
        }
        s_sha512_compress(md, md->buf);
        md->curlen = 0;
    }

    /* pad upto 120 bytes of zeroes
     * note: that from 112 to 120 is the 64 MSB of the length.  We assume that you won't hash
     * > 2^64 bits of data... :-)
     */
    while (md->curlen < 120) {
        md->buf[md->curlen++] = (unsigned char)0;
    }

    /* store length */
    STORE64H(md->length, md->buf+120);
    s_sha512_compress(md, md->buf);

    /* copy output */
    for (i = 0; i < 8; i++) {
        STORE64H(md->state[i], out+(8*i));
    }

    return 0;
}